

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall brynet::net::EventLoop::processAsyncProcs(EventLoop *this)

{
  pointer pfVar1;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range1;
  function<void_()> *x;
  pointer this_00;
  
  std::mutex::lock(&this->mAsyncProcsMutex);
  std::_Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->mCopyAsyncProcs,(_Vector_impl_data *)&this->mAsyncProcs);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  pfVar1 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->mCopyAsyncProcs).
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar1; this_00 = this_00 + 1
      ) {
    std::function<void_()>::operator()(this_00);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::clear
            (&this->mCopyAsyncProcs);
  return;
}

Assistant:

void EventLoop::processAsyncProcs()
{
    {
        std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
        mCopyAsyncProcs.swap(mAsyncProcs);
    }

    for (const auto& x : mCopyAsyncProcs)
    {
        x();
    }
    mCopyAsyncProcs.clear();
}